

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCompare(Parse *pParse,Expr *pA,Expr *pB,int iTab)

{
  int iVar1;
  uint uVar2;
  int in_ECX;
  Parse *in_RDX;
  Parse *in_RSI;
  Expr *in_RDI;
  u32 combinedFlags;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((in_RSI == (Parse *)0x0) || (in_RDX == (Parse *)0x0)) {
    iVar1 = 2;
    if (in_RDX == in_RSI) {
      iVar1 = 0;
    }
  }
  else if ((in_RDI == (Expr *)0x0) || (*(char *)&in_RSI->db != -99)) {
    uVar2 = *(uint *)((long)&in_RSI->db + 4) | *(u32 *)((long)&in_RDX->db + 4);
    if ((uVar2 & 0x800) == 0) {
      if ((*(u8 *)&in_RSI->db != *(u8 *)&in_RDX->db) || (*(char *)&in_RSI->db == 'H')) {
        if ((*(char *)&in_RSI->db == 'r') &&
           (iVar1 = sqlite3ExprCompare(in_RSI,(Expr *)in_RDX,(Expr *)CONCAT44(in_ECX,uVar2),0),
           iVar1 < 2)) {
          return 1;
        }
        if ((*(char *)&in_RDX->db == 'r') &&
           (iVar1 = sqlite3ExprCompare(in_RSI,(Expr *)in_RDX,(Expr *)CONCAT44(in_ECX,uVar2),0),
           iVar1 < 2)) {
          return 1;
        }
        if ((((*(char *)&in_RSI->db != -0x56) || (*(u8 *)&in_RDX->db != 0xa8)) ||
            (-1 < in_RDX->nRangeReg)) || (in_RSI->nRangeReg != in_ECX)) {
          return 2;
        }
      }
      if (in_RSI->zErrMsg != (char *)0x0) {
        if ((*(char *)&in_RSI->db == -0x54) || (*(char *)&in_RSI->db == -0x57)) {
          iVar1 = sqlite3StrICmp(in_RSI->zErrMsg,
                                 ((anon_union_8_2_443a03b8_for_u *)&in_RDX->zErrMsg)->zToken);
          if (iVar1 != 0) {
            return 2;
          }
          if ((((ulong)in_RSI->db & 0x100000000000000) != 0) !=
              (((ulong)in_RDX->db & 0x100000000000000) != 0)) {
            return 2;
          }
          if ((((ulong)in_RSI->db & 0x100000000000000) != 0) &&
             (iVar1 = sqlite3WindowCompare
                                (in_RSI,(Window *)in_RDX,(Window *)CONCAT44(in_ECX,uVar2),0),
             iVar1 != 0)) {
            return 2;
          }
        }
        else {
          if (*(char *)&in_RSI->db == 'z') {
            return 0;
          }
          if (*(char *)&in_RSI->db == 'r') {
            iVar1 = sqlite3_stricmp((char *)CONCAT44(in_ECX,uVar2),(char *)0x1ceea3);
            if (iVar1 != 0) {
              return 2;
            }
          }
          else if ((((((anon_union_8_2_443a03b8_for_u *)&in_RDX->zErrMsg)->zToken != (char *)0x0) &&
                    (*(char *)&in_RSI->db != -0x58)) && (*(char *)&in_RSI->db != -0x56)) &&
                  (iVar1 = strcmp(in_RSI->zErrMsg,
                                  ((anon_union_8_2_443a03b8_for_u *)&in_RDX->zErrMsg)->zToken),
                  iVar1 != 0)) {
            return 2;
          }
        }
      }
      if ((*(uint *)((long)&in_RSI->db + 4) & 0x404) == (*(uint *)((long)&in_RDX->db + 4) & 0x404))
      {
        if ((uVar2 & 0x10000) == 0) {
          if ((uVar2 & 0x1000) != 0) {
            return 2;
          }
          if (((uVar2 & 0x20) == 0) &&
             (iVar1 = sqlite3ExprCompare(in_RSI,(Expr *)in_RDX,(Expr *)CONCAT44(in_ECX,uVar2),0),
             iVar1 != 0)) {
            return 2;
          }
          iVar1 = sqlite3ExprCompare(in_RSI,(Expr *)in_RDX,(Expr *)CONCAT44(in_ECX,uVar2),0);
          if (iVar1 != 0) {
            return 2;
          }
          iVar1 = sqlite3ExprListCompare
                            ((ExprList *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (ExprList *)in_RDI,(int)((ulong)in_RSI >> 0x20));
          if (iVar1 != 0) {
            return 2;
          }
          if (((*(char *)&in_RSI->db != 'v') && (*(char *)&in_RSI->db != -0x55)) &&
             ((uVar2 & 0x4000) == 0)) {
            if ((short)in_RSI->iRangeReg != (short)in_RDX->iRangeReg) {
              return 2;
            }
            if ((*(char *)((long)&in_RSI->db + 2) != *(char *)((long)&in_RDX->db + 2)) &&
               (*(char *)&in_RSI->db == -0x51)) {
              return 2;
            }
            if (((*(char *)&in_RSI->db != '2') && (in_RSI->nRangeReg != in_RDX->nRangeReg)) &&
               (in_RSI->nRangeReg != in_ECX)) {
              return 2;
            }
          }
        }
        iVar1 = 0;
      }
      else {
        iVar1 = 2;
      }
    }
    else if (((*(uint *)((long)&in_RSI->db + 4) & *(u32 *)((long)&in_RDX->db + 4) & 0x800) == 0) ||
            (*(int *)&in_RSI->zErrMsg != ((anon_union_8_2_443a03b8_for_u *)&in_RDX->zErrMsg)->iValue
            )) {
      iVar1 = 2;
    }
    else {
      iVar1 = 0;
    }
  }
  else {
    iVar1 = exprCompareVariable((Parse *)CONCAT44(in_stack_fffffffffffffffc,
                                                  in_stack_fffffffffffffff8),in_RDI,(Expr *)in_RSI);
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCompare(
  const Parse *pParse,
  const Expr *pA,
  const Expr *pB,
  int iTab
){
  u32 combinedFlags;
  if( pA==0 || pB==0 ){
    return pB==pA ? 0 : 2;
  }
  if( pParse && pA->op==TK_VARIABLE ){
    return exprCompareVariable(pParse, pA, pB);
  }
  combinedFlags = pA->flags | pB->flags;
  if( combinedFlags & EP_IntValue ){
    if( (pA->flags&pB->flags&EP_IntValue)!=0 && pA->u.iValue==pB->u.iValue ){
      return 0;
    }
    return 2;
  }
  if( pA->op!=pB->op || pA->op==TK_RAISE ){
    if( pA->op==TK_COLLATE && sqlite3ExprCompare(pParse, pA->pLeft,pB,iTab)<2 ){
      return 1;
    }
    if( pB->op==TK_COLLATE && sqlite3ExprCompare(pParse, pA,pB->pLeft,iTab)<2 ){
      return 1;
    }
    if( pA->op==TK_AGG_COLUMN && pB->op==TK_COLUMN
     && pB->iTable<0 && pA->iTable==iTab
    ){
      /* fall through */
    }else{
      return 2;
    }
  }
  assert( !ExprHasProperty(pA, EP_IntValue) );
  assert( !ExprHasProperty(pB, EP_IntValue) );
  if( pA->u.zToken ){
    if( pA->op==TK_FUNCTION || pA->op==TK_AGG_FUNCTION ){
      if( sqlite3StrICmp(pA->u.zToken,pB->u.zToken)!=0 ) return 2;
#ifndef SQLITE_OMIT_WINDOWFUNC
      assert( pA->op==pB->op );
      if( ExprHasProperty(pA,EP_WinFunc)!=ExprHasProperty(pB,EP_WinFunc) ){
        return 2;
      }
      if( ExprHasProperty(pA,EP_WinFunc) ){
        if( sqlite3WindowCompare(pParse, pA->y.pWin, pB->y.pWin, 1)!=0 ){
          return 2;
        }
      }
#endif
    }else if( pA->op==TK_NULL ){
      return 0;
    }else if( pA->op==TK_COLLATE ){
      if( sqlite3_stricmp(pA->u.zToken,pB->u.zToken)!=0 ) return 2;
    }else
    if( pB->u.zToken!=0
     && pA->op!=TK_COLUMN
     && pA->op!=TK_AGG_COLUMN
     && strcmp(pA->u.zToken,pB->u.zToken)!=0
    ){
      return 2;
    }
  }
  if( (pA->flags & (EP_Distinct|EP_Commuted))
     != (pB->flags & (EP_Distinct|EP_Commuted)) ) return 2;
  if( ALWAYS((combinedFlags & EP_TokenOnly)==0) ){
    if( combinedFlags & EP_xIsSelect ) return 2;
    if( (combinedFlags & EP_FixedCol)==0
     && sqlite3ExprCompare(pParse, pA->pLeft, pB->pLeft, iTab) ) return 2;
    if( sqlite3ExprCompare(pParse, pA->pRight, pB->pRight, iTab) ) return 2;
    if( sqlite3ExprListCompare(pA->x.pList, pB->x.pList, iTab) ) return 2;
    if( pA->op!=TK_STRING
     && pA->op!=TK_TRUEFALSE
     && ALWAYS((combinedFlags & EP_Reduced)==0)
    ){
      if( pA->iColumn!=pB->iColumn ) return 2;
      if( pA->op2!=pB->op2 && pA->op==TK_TRUTH ) return 2;
      if( pA->op!=TK_IN && pA->iTable!=pB->iTable && pA->iTable!=iTab ){
        return 2;
      }
    }
  }
  return 0;
}